

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  bool bVar1;
  SQObjectPtr local_68 [2];
  SQObjectPtr local_48;
  SQOuter *local_38;
  SQOuter *otr;
  SQOuter *p;
  SQOuter **pp;
  SQObjectPtr *stackindex_local;
  SQObjectPtr *target_local;
  SQVM *this_local;
  
  p = (SQOuter *)&this->_openouters;
  while( true ) {
    otr = (SQOuter *)(p->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
    bVar1 = false;
    if (otr != (SQOuter *)0x0) {
      bVar1 = stackindex <= otr->_valptr;
    }
    pp = (SQOuter **)stackindex;
    stackindex_local = target;
    target_local = (SQObjectPtr *)this;
    if (!bVar1) break;
    if (otr->_valptr == stackindex) {
      ::SQObjectPtr::SQObjectPtr(&local_48,otr);
      ::SQObjectPtr::operator=(stackindex_local,&local_48);
      ::SQObjectPtr::~SQObjectPtr(&local_48);
      return;
    }
    p = (SQOuter *)&otr->_next;
  }
  local_38 = SQOuter::Create(this->_sharedstate,stackindex);
  local_38->_next = (SQOuter *)(p->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted;
  local_38->_idx = (long)pp - (long)(this->_stack)._vals >> 4;
  (local_38->super_SQCollectable).super_SQRefCounted._uiRef =
       (local_38->super_SQCollectable).super_SQRefCounted._uiRef + 1;
  (p->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted = (_func_int **)local_38;
  ::SQObjectPtr::SQObjectPtr(local_68,local_38);
  ::SQObjectPtr::operator=(stackindex_local,local_68);
  ::SQObjectPtr::~SQObjectPtr(local_68);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}